

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::MergeFrom(Options *this,Message *from)

{
  LogMessage *other;
  Options *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((Options *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O2/src/bloaty.pb.cc"
               ,0x327);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = google::protobuf::DynamicCastToGenerated<bloaty::Options>(from);
  if (from_00 == (Options *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void Options::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:bloaty.Options)
  GOOGLE_DCHECK_NE(&from, this);
  const Options* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<Options>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:bloaty.Options)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:bloaty.Options)
    MergeFrom(*source);
  }
}